

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void pq_add(roaring_pq_t *pq,roaring_pq_element_t *t)

{
  roaring_pq_element_t *prVar1;
  roaring_bitmap_t *prVar2;
  roaring_pq_element_t *prVar3;
  _Bool _Var4;
  undefined7 uVar5;
  ulong uVar6;
  ulong uVar7;
  
  prVar1 = pq->elements;
  uVar6 = pq->size;
  pq->size = uVar6 + 1;
  prVar1[uVar6].bitmap = t->bitmap;
  _Var4 = t->is_temporary;
  uVar5 = *(undefined7 *)&t->field_0x9;
  prVar1 = prVar1 + uVar6;
  prVar1->size = t->size;
  prVar1->is_temporary = _Var4;
  *(undefined7 *)&prVar1->field_0x9 = uVar5;
  while (uVar6 != 0) {
    uVar7 = uVar6 - 1 >> 1;
    prVar1 = pq->elements;
    if (prVar1[uVar7].size <= t->size) goto LAB_0011f011;
    prVar1[uVar6].size = prVar1[uVar7].size;
    uVar5 = *(undefined7 *)&prVar1[uVar7].field_0x9;
    prVar2 = prVar1[uVar7].bitmap;
    prVar3 = prVar1 + uVar6;
    prVar3->is_temporary = prVar1[uVar7].is_temporary;
    *(undefined7 *)&prVar3->field_0x9 = uVar5;
    *(roaring_bitmap_t **)(&prVar3->is_temporary + 8) = prVar2;
    uVar6 = uVar7;
  }
  uVar6 = 0;
LAB_0011f011:
  prVar1 = pq->elements;
  prVar1[uVar6].bitmap = t->bitmap;
  _Var4 = t->is_temporary;
  uVar5 = *(undefined7 *)&t->field_0x9;
  prVar1 = prVar1 + uVar6;
  prVar1->size = t->size;
  prVar1->is_temporary = _Var4;
  *(undefined7 *)&prVar1->field_0x9 = uVar5;
  return;
}

Assistant:

static void pq_add(roaring_pq_t *pq, roaring_pq_element_t *t) {
    uint64_t i = pq->size;
    pq->elements[pq->size++] = *t;
    while (i > 0) {
        uint64_t p = (i - 1) >> 1;
        roaring_pq_element_t ap = pq->elements[p];
        if (!compare(t, &ap)) break;
        pq->elements[i] = ap;
        i = p;
    }
    pq->elements[i] = *t;
}